

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O2

void __thiscall cmCTestUploadCommand::CheckArguments(cmCTestUploadCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  cmCTestUploadCommand *local_40;
  cmCTestUploadCommand *local_38;
  
  _Var4._M_current =
       (this->Files).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Files).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)_Var4._M_current;
  local_40 = this;
  local_38 = this;
  for (lVar5 = lVar3 >> 7; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (bVar2) goto LAB_00497985;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                       _Var4._M_current + 1);
    __first._M_current = _Var4._M_current + 1;
    if (bVar2) goto LAB_00497985;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                       _Var4._M_current + 2);
    __first._M_current = _Var4._M_current + 2;
    if (bVar2) goto LAB_00497985;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                       _Var4._M_current + 3);
    __first._M_current = _Var4._M_current + 3;
    if (bVar2) goto LAB_00497985;
    _Var4._M_current = _Var4._M_current + 4;
    lVar3 = lVar3 + -0x80;
  }
  lVar3 = lVar3 >> 5;
  if (lVar3 == 1) {
LAB_00497a04:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      __first._M_current = pbVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_004979e8:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_00497a04;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar3 != 3) goto LAB_004979c3;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_004979e8;
    }
  }
LAB_00497985:
  if (__first._M_current != pbVar1) {
    _Var4._M_current = __first._M_current;
    while (_Var4._M_current = _Var4._M_current + 1, _Var4._M_current != pbVar1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_38,_Var4)
      ;
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)_Var4._M_current);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_004979c3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&(this->Files).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ,(const_iterator)__first._M_current,
          (this->Files).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmCTestUploadCommand::CheckArguments()
{
  cm::erase_if(this->Files, [this](std::string const& arg) -> bool {
    if (!cmSystemTools::FileExists(arg)) {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return true;
    }
    return false;
  });
}